

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O1

void gravity_function_serialize(gravity_function_t *f,json_t *json)

{
  uint uVar1;
  uint uVar2;
  uint32_t k;
  uint uVar3;
  char *key;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  uint32_t i;
  ulong uVar7;
  ulong uVar8;
  char temp [256];
  char local_138 [264];
  
  pcVar4 = f->identifier;
  if (f->tag == EXEC_TYPE_SPECIAL) {
    gravity_function_special_serialize(f,pcVar4,json);
    return;
  }
  if (pcVar4 == (char *)0x0) {
    pcVar4 = local_138;
    snprintf(pcVar4,0x100,"$anon_%p",f);
  }
  key = json_get_label(json,pcVar4);
  json_begin_object(json,key);
  json_add_cstring(json,"type","function");
  json_add_cstring(json,"identifier",pcVar4);
  json_add_int(json,"tag",(ulong)f->tag);
  json_add_int(json,"nparam",(ulong)f->nparams);
  json_add_bool(json,"args",(f->field_9).field_0.useargs);
  if (f->tag != EXEC_TYPE_NATIVE) goto LAB_0012ce20;
  json_add_int(json,"nlocal",(ulong)f->nlocals);
  json_add_int(json,"ntemp",(ulong)f->ntemps);
  json_add_int(json,"nup",(ulong)f->nupvalues);
  json_add_double(json,"purity",(double)(f->field_9).field_0.purity);
  if ((f->field_9).field_0.bytecode == (uint32_t *)0x0) {
LAB_0012cd5c:
    json_add_null(json,"bytecode");
  }
  else {
    uVar1 = (f->field_9).field_0.ninsts;
    if ((ulong)uVar1 == 0) goto LAB_0012cd5c;
    uVar7 = 0;
    pcVar4 = (char *)gravity_calloc((gravity_vm *)0x0,1,(ulong)(uVar1 * 8));
    uVar3 = 0;
    do {
      uVar2 = (f->field_9).field_0.bytecode[uVar7];
      iVar6 = 0x1c;
      do {
        uVar5 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
        pcVar4[uVar5] = "0123456789ABCDEF"[uVar2 >> ((byte)iVar6 & 0x1f) & 0xf];
        iVar6 = iVar6 + -4;
      } while (iVar6 != -4);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar1);
    json_add_string(json,"bytecode",pcVar4,(ulong)(uVar1 * 8));
    free(pcVar4);
    if ((f->field_9).field_0.lineno != (uint32_t *)0x0) {
      uVar1 = (f->field_9).field_0.ninsts;
      uVar7 = 0;
      pcVar4 = (char *)gravity_calloc((gravity_vm *)0x0,1,(ulong)(uVar1 * 8));
      if ((ulong)uVar1 != 0) {
        uVar5 = 0;
        do {
          uVar3 = (f->field_9).field_0.lineno[uVar5];
          iVar6 = 0x1c;
          uVar8 = uVar7;
          do {
            uVar7 = (ulong)((int)uVar8 + 1);
            pcVar4[uVar8] = "0123456789ABCDEF"[uVar3 >> ((byte)iVar6 & 0x1f) & 0xf];
            iVar6 = iVar6 + -4;
            uVar8 = uVar7;
          } while (iVar6 != -4);
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar1);
      }
      json_add_string(json,"lineno",pcVar4,(ulong)(uVar1 * 8));
      free(pcVar4);
    }
  }
  json_begin_array(json,"pool");
  gravity_function_array_serialize(f,json,(f->field_9).field_0.cpool);
  json_end_array(json);
  if ((f->field_9).field_0.pvalue.n != 0) {
    json_begin_array(json,"pvalues");
    gravity_function_array_serialize(f,json,(f->field_9).field_0.pvalue);
    json_end_array(json);
  }
  if ((f->field_9).field_0.pname.n != 0) {
    json_begin_array(json,"pnames");
    gravity_function_array_serialize(f,json,(f->field_9).field_0.pname);
    json_end_array(json);
  }
LAB_0012ce20:
  json_end_object(json);
  return;
}

Assistant:

void gravity_function_serialize (gravity_function_t *f, json_t *json) {
    // special functions need a special serialization
    if (f->tag == EXEC_TYPE_SPECIAL) {
        gravity_function_special_serialize(f, f->identifier, json);
        return;
    }

    // compute identifier (cannot be NULL)
    const char *identifier = f->identifier;
    char temp[256];
    if (!identifier) {snprintf(temp, sizeof(temp), "$anon_%p", f); identifier = temp;}

    const char *label = json_get_label(json, identifier);
    json_begin_object(json, label);
    
    json_add_cstring(json, GRAVITY_JSON_LABELTYPE, GRAVITY_JSON_FUNCTION);  // MANDATORY 1st FIELD
    json_add_cstring(json, GRAVITY_JSON_LABELIDENTIFIER, identifier);       // MANDATORY 2nd FIELD (not for getter/setter)
    json_add_int(json, GRAVITY_JSON_LABELTAG, f->tag);

    // common fields
    json_add_int(json, GRAVITY_JSON_LABELNPARAM, f->nparams);
    json_add_bool(json, GRAVITY_JSON_LABELARGS, f->useargs);

    if (f->tag == EXEC_TYPE_NATIVE) {
        // native only fields
        json_add_int(json, GRAVITY_JSON_LABELNLOCAL, f->nlocals);
        json_add_int(json, GRAVITY_JSON_LABELNTEMP, f->ntemps);
        json_add_int(json, GRAVITY_JSON_LABELNUPV, f->nupvalues);
        json_add_double(json, GRAVITY_JSON_LABELPURITY, f->purity);

        // bytecode
        gravity_function_bytecode_serialize(f, json);

        // constant pool
        json_begin_array(json, GRAVITY_JSON_LABELPOOL);
        gravity_function_array_serialize(f, json, f->cpool);
        json_end_array(json);
        
        // default values (if any)
        if (marray_size(f->pvalue)) {
            json_begin_array(json, GRAVITY_JSON_LABELPVALUES);
            gravity_function_array_serialize(f, json, f->pvalue);
        json_end_array(json);
    }

        // arg names (if any)
        if (marray_size(f->pname)) {
            json_begin_array(json, GRAVITY_JSON_LABELPNAMES);
            gravity_function_array_serialize(f, json, f->pname);
            json_end_array(json);
        }
    }
    
    json_end_object(json);
}